

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O2

void duckdb::GetIntegerIntervalFunctions<duckdb::ToWeeksOperator>(void)

{
  BaseScalarFunction *pBVar1;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  BaseScalarFunction *function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_409;
  LogicalType local_408 [24];
  code *local_3f0 [2];
  code *local_3e0;
  code *local_3d8;
  code *local_3d0 [2];
  code *local_3c0;
  code *local_3b8;
  LogicalType local_3b0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_398;
  LogicalType local_380 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_368;
  LogicalType local_350 [24];
  LogicalType local_338 [24];
  ScalarFunction local_320;
  ScalarFunction local_1f8;
  BaseScalarFunction local_d0 [176];
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_408,INTEGER);
  __l._M_len = 1;
  __l._M_array = local_408;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_368,__l,&local_409);
  duckdb::LogicalType::LogicalType(local_380,INTERVAL);
  local_3d0[1] = (code *)0x0;
  local_3d0[0] = ScalarFunction::UnaryFunction<int,duckdb::interval_t,duckdb::ToWeeksOperator>;
  local_3b8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_3c0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_338,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_1f8,&local_368,local_380,local_3d0,0,0,0,0,local_338,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_1f8);
  ScalarFunction::~ScalarFunction(&local_1f8);
  duckdb::LogicalType::~LogicalType(local_338);
  std::_Function_base::~_Function_base((_Function_base *)local_3d0);
  duckdb::LogicalType::~LogicalType(local_380);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_368);
  duckdb::LogicalType::~LogicalType(local_408);
  duckdb::LogicalType::LogicalType(local_408,BIGINT);
  __l_00._M_len = 1;
  __l_00._M_array = local_408;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_398,__l_00,&local_409);
  duckdb::LogicalType::LogicalType(local_3b0,INTERVAL);
  local_3f0[1] = (code *)0x0;
  local_3f0[0] = ScalarFunction::UnaryFunction<long,duckdb::interval_t,duckdb::ToWeeksOperator>;
  local_3d8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_3e0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_350,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_320,&local_398,local_3b0,local_3f0,0,0,0,0,local_350,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_320);
  ScalarFunction::~ScalarFunction(&local_320);
  duckdb::LogicalType::~LogicalType(local_350);
  std::_Function_base::~_Function_base((_Function_base *)local_3f0);
  duckdb::LogicalType::~LogicalType(local_3b0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_398);
  duckdb::LogicalType::~LogicalType(local_408);
  pBVar1 = *(BaseScalarFunction **)(in_RDI + 0x28);
  for (function = *(BaseScalarFunction **)(in_RDI + 0x20); function != pBVar1;
      function = function + 0x128) {
    BaseScalarFunction::SetReturnsError(local_d0,function);
    duckdb::BaseScalarFunction::~BaseScalarFunction(local_d0);
  }
  return;
}

Assistant:

ScalarFunctionSet GetIntegerIntervalFunctions() {
	ScalarFunctionSet function_set;
	function_set.AddFunction(ScalarFunction({LogicalType::INTEGER}, LogicalType::INTERVAL,
	                                        ScalarFunction::UnaryFunction<int32_t, interval_t, OP>));
	function_set.AddFunction(ScalarFunction({LogicalType::BIGINT}, LogicalType::INTERVAL,
	                                        ScalarFunction::UnaryFunction<int64_t, interval_t, OP>));
	for (auto &func : function_set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return function_set;
}